

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<EnumNameValue>::relocate
          (QArrayDataPointer<EnumNameValue> *this,qsizetype offset,EnumNameValue **data)

{
  EnumNameValue *d_first;
  EnumNameValue *pEVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<EnumNameValue,long_long>(this->ptr,this->size,d_first);
  if (data != (EnumNameValue **)0x0) {
    pEVar1 = *data;
    if ((this->ptr <= pEVar1) && (pEVar1 < this->ptr + this->size)) {
      *data = pEVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }